

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<45UL,_GF2::MOGrlex<45UL>_>::Union(MP<45UL,_GF2::MOGrlex<45UL>_> *this,MM<45UL> *mRight)

{
  size_t *psVar1;
  _List_iterator<GF2::MM<45UL>_> _Var2;
  _List_node_base *p_Var3;
  
  _Var2 = std::
          __lower_bound<std::_List_iterator<GF2::MM<45ul>>,GF2::MM<45ul>,__gnu_cxx::__ops::_Iter_comp_val<GF2::MOGrlex<45ul>>>
                    ((this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
                     super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl.
                     _M_node.super__List_node_base._M_next,this,mRight);
  if ((_Var2._M_node == (_List_node_base *)this) ||
     (_Var2._M_node[1]._M_next != (_List_node_base *)(mRight->super_WW<45UL>)._words[0])) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)(mRight->super_WW<45UL>)._words[0];
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
              super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Union(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
	}